

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
__thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
          *node)

{
  bool bVar1;
  pointer pMVar2;
  type this_00;
  unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
  *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_b0;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_a8;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_a0;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_90;
  reference local_80;
  pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  *param;
  iterator __end1_1;
  iterator __begin1_1;
  Parameters *__range1_1;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_50;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_48;
  reference local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  *conn;
  iterator __end1;
  iterator __begin1;
  Connections *__range1;
  unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
  *node_local;
  Transformer *this_local;
  
  pMVar2 = std::
           unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
           ::operator->(in_RDX);
  this_00 = std::unique_ptr<verilogAST::Connections,_std::default_delete<verilogAST::Connections>_>
            ::operator*(&pMVar2->connections);
  __end1 = Connections::begin_abi_cxx11_(this_00);
  conn = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
          *)Connections::end_abi_cxx11_(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                                *)&conn);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    unique_ptr(&local_50,&local_40->second);
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl)
              (&local_48,node,&local_50);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
              (&local_40->second,&local_48);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_48);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
    ::operator++(&__end1);
  }
  pMVar2 = std::
           unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
           ::operator->(in_RDX);
  __end1_1 = std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::begin(&pMVar2->parameters);
  param = (pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
           *)std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::end(&pMVar2->parameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                        *)&param);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
               ::operator*(&__end1_1);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::variant(&local_a0,&local_80->first);
    (*(code *)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
              .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl[1].
              module_name.field_2._M_allocated_capacity)(&local_90,node,&local_a0);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::operator=(&local_80->first,&local_90);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~variant(&local_90);
    std::
    variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~variant(&local_a0);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    unique_ptr(&local_b0,&local_80->second);
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl)
              (&local_a8,node,&local_b0);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
              (&local_80->second,&local_a8);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_a8);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_b0);
    __gnu_cxx::
    __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
  ::unique_ptr((unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>,_true,_true>
          )(__uniq_ptr_data<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ModuleInstantiation> Transformer::visit(
    std::unique_ptr<ModuleInstantiation> node) {
  for (auto&& conn : *node->connections) {
    conn.second = this->visit(std::move(conn.second));
  }
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  return node;
}